

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O3

void __thiscall
gmath::RadialDistortion::RadialDistortion(RadialDistortion *this,Properties *prop,int id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int in_ECX;
  int iVar5;
  undefined4 in_register_00000014;
  string local_50;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00124840;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)"k1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar5 = 0x11f173;
  gutil::Properties::getValue<double>(prop,local_50._M_dataplus._M_p,this->kd,"0");
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,iVar5);
  iVar5 = 0x11f173;
  gutil::Properties::getValue<double>(prop,local_50._M_dataplus._M_p,this->kd + 1,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,iVar5);
  gutil::Properties::getValue<double>(prop,local_50._M_dataplus._M_p,this->kd + 2,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->kn = 0;
  dVar2 = this->kd[2];
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    this->kn = 1;
    iVar5 = 2;
  }
  else {
    dVar3 = this->kd[1];
    iVar4 = 1;
    iVar5 = 1;
    if ((((dVar3 == 0.0) && (!NAN(dVar3))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
      dVar2 = this->kd[0];
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return;
      }
      goto LAB_00110175;
    }
  }
  this->kn = iVar5;
  iVar4 = iVar5 + 1;
LAB_00110175:
  this->kn = iVar4;
  return;
}

Assistant:

RadialDistortion::RadialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("k1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[1], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[2], "0");

  kn=0;

  if (kd[2] != 0)
  {
    kn++;
  }

  if (kd[1] != 0 || kn > 0)
  {
    kn++;
  }

  if (kd[0] != 0 || kn > 0)
  {
    kn++;
  }
}